

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Chapters::Atom::ExpandDisplaysArray(Atom *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  Display *pDVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  
  iVar3 = this->m_displays_size;
  uVar4 = this->m_displays_count;
  bVar11 = true;
  if (iVar3 <= (int)uVar4) {
    iVar12 = 1;
    if (iVar3 != 0) {
      iVar12 = iVar3 * 2;
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)iVar12;
    uVar8 = SUB168(auVar6 * ZEXT816(0x18),0);
    uVar10 = uVar8 + 8;
    if (0xfffffffffffffff7 < uVar8) {
      uVar10 = 0xffffffffffffffff;
    }
    uVar8 = 0xffffffffffffffff;
    if (SUB168(auVar6 * ZEXT816(0x18),8) == 0) {
      uVar8 = uVar10;
    }
    puVar9 = (ulong *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
    uVar10 = 0;
    if (puVar9 == (ulong *)0x0) {
      bVar11 = false;
    }
    else {
      *puVar9 = (long)iVar12;
      pDVar5 = this->m_displays;
      uVar8 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar8 = uVar10;
      }
      for (; uVar8 * 0x18 - uVar10 != 0; uVar10 = uVar10 + 0x18) {
        puVar1 = (undefined8 *)((long)&pDVar5->m_string + uVar10);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)puVar9 + uVar10 + 8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        *(undefined8 *)((long)puVar9 + uVar10 + 0x18) =
             *(undefined8 *)((long)&pDVar5->m_country + uVar10);
      }
      if (pDVar5 != (Display *)0x0) {
        operator_delete__(&pDVar5[-1].m_country);
      }
      this->m_displays = (Display *)(puVar9 + 1);
      this->m_displays_size = iVar12;
    }
  }
  return bVar11;
}

Assistant:

bool Chapters::Atom::ExpandDisplaysArray() {
  if (m_displays_size > m_displays_count)
    return true;  // nothing else to do

  const int size = (m_displays_size == 0) ? 1 : 2 * m_displays_size;

  Display* const displays = new (std::nothrow) Display[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_displays_count; ++idx) {
    m_displays[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_displays;
  m_displays = displays;

  m_displays_size = size;
  return true;
}